

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_xor.cpp
# Opt level: O2

float meanLoss(Net *net,LabeledDataset *dataset)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  DatasetIterator __end1;
  float local_64;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  
  local_60._0_8_ =
       (dataset->inputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_60._8_8_ =
       (dataset->inputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_50._0_8_ =
       (dataset->outputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_50._8_8_ =
       (dataset->outputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_40._8_4_ = (undefined4)local_60._8_8_;
  local_40._12_4_ = (undefined4)((ulong)local_60._8_8_ >> 0x20);
  local_40._0_8_ = local_60._8_8_;
  local_30._8_4_ = (int)local_50._8_8_;
  local_30._0_8_ = local_50._8_8_;
  local_30._12_4_ = (int)((ulong)local_50._8_8_ >> 0x20);
  local_64 = 0.0;
  iVar2 = 0;
  while( true ) {
    bVar1 = notch::core::LabeledDataset::DatasetIterator::operator!=
                      ((DatasetIterator *)local_60,(DatasetIterator *)local_40);
    if (!bVar1) break;
    fVar3 = notch::core::Net::loss(net,(Array *)local_60._0_8_,(Array *)local_50._0_8_);
    if ((local_60._0_8_ != local_60._8_8_) && (local_50._0_8_ != local_50._8_8_)) {
      local_60._0_8_ = (valarray<float> *)(local_60._0_8_ + 0x10);
      local_50._0_8_ = (valarray<float> *)(local_50._0_8_ + 0x10);
    }
    local_64 = local_64 + fVar3;
    iVar2 = iVar2 + 1;
  }
  return local_64 / (float)iVar2;
}

Assistant:

float meanLoss(Net &net, LabeledDataset &dataset) {
    float total = 0.0;
    int n = 0;
    for (auto sample : dataset) {
        total += net.loss(sample.data, sample.label);
        n++;
    }
    return total / n;
}